

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CudaConfig.cpp
# Opt level: O2

void __thiscall xmrig::CudaConfig::generate(CudaConfig *this)

{
  bool bVar1;
  int iVar2;
  uint32_t uVar3;
  size_t sVar4;
  vector<xmrig::CudaDevice,_std::allocator<xmrig::CudaDevice>_> devices;
  vector<xmrig::CudaDevice,_std::allocator<xmrig::CudaDevice>_> local_48;
  _Vector_base<xmrig::CudaThread,_std::allocator<xmrig::CudaThread>_> local_30;
  
  if ((generated == '\0') && (this->m_enabled == true)) {
    bVar1 = Threads<xmrig::CudaThreads>::has(&this->m_threads);
    if (!bVar1) {
      iVar2 = CudaLib::init((EVP_PKEY_CTX *)(this->m_loader).m_data);
      if ((char)iVar2 != '\0') {
        uVar3 = CudaLib::runtimeVersion();
        if (uVar3 != 0) {
          uVar3 = CudaLib::driverVersion();
          if (uVar3 != 0) {
            uVar3 = CudaLib::deviceCount();
            if (uVar3 != 0) {
              CudaLib::devices(&local_48,this->m_bfactor,this->m_bsleep,&this->m_devicesHint);
              if (local_48.super__Vector_base<xmrig::CudaDevice,_std::allocator<xmrig::CudaDevice>_>
                  ._M_impl.super__Vector_impl_data._M_start !=
                  local_48.super__Vector_base<xmrig::CudaDevice,_std::allocator<xmrig::CudaDevice>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
                CudaThreads::CudaThreads((CudaThreads *)&local_30,&local_48);
                sVar4 = Threads<xmrig::CudaThreads>::move
                                  (&this->m_threads,"cn/blur",(CudaThreads *)&local_30);
                std::_Vector_base<xmrig::CudaThread,_std::allocator<xmrig::CudaThread>_>::
                ~_Vector_base(&local_30);
                generated = '\x01';
                this->m_shouldSave = sVar4 != 0;
              }
              std::vector<xmrig::CudaDevice,_std::allocator<xmrig::CudaDevice>_>::~vector(&local_48)
              ;
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void xmrig::CudaConfig::generate()
{
    if (generated) {
        return;
    }

    if (!isEnabled() || m_threads.has()) {
        return;
    }

    if (!CudaLib::init(loader())) {
        return;
    }

    if (!CudaLib::runtimeVersion() || !CudaLib::driverVersion() || !CudaLib::deviceCount()) {
        return;
    }

    const auto devices = CudaLib::devices(bfactor(), bsleep(), m_devicesHint);
    if (devices.empty()) {
        return;
    }

    size_t count = 0;
    count += xmrig::generate(m_threads, devices);

    generated    = true;
    m_shouldSave = count > 0;
}